

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::UpdateStatusBar(cmCursesMainForm *this,char *message)

{
  cmState *pcVar1;
  uint uVar2;
  FIELD *field;
  long *plVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  void *__s;
  ulong __n;
  int iVar9;
  uint uVar10;
  char fmt_s [3];
  char help [128];
  char bar [512];
  char version [512];
  char vertmp [128];
  undefined2 local_544;
  undefined1 local_542;
  char *local_540;
  ulong local_538 [16];
  string local_4b8;
  char acStack_498 [33];
  undefined1 auStack_477 [447];
  string local_2b8 [2];
  undefined1 auStack_277 [447];
  allocator<char> local_b8 [136];
  
  uVar10 = 0xffffffff;
  iVar9 = -1;
  if (_stdscr != 0) {
    iVar9 = *(short *)(_stdscr + 4) + 1;
    uVar10 = (int)*(short *)(_stdscr + 6) + 1;
  }
  if ((((int)uVar10 < 0x41) || ((int)uVar10 < this->InitialWidth)) || (iVar9 < 6)) {
    erase();
    clearok(_stdscr,1);
    move(0,0);
    builtin_strncpy(acStack_498 + 0x10," required.",0xb);
    builtin_strncpy(acStack_498,"t least %dx%d is",0x10);
    local_4b8.field_2._M_local_buf[0] = 'a';
    local_4b8.field_2._M_local_buf[1] = 'l';
    local_4b8.field_2._M_local_buf[2] = 'l';
    local_4b8.field_2._M_local_buf[3] = '.';
    local_4b8.field_2._M_local_buf[4] = ' ';
    local_4b8.field_2._M_local_buf[5] = 'A';
    local_4b8.field_2._M_local_buf[6] = ' ';
    local_4b8.field_2._M_local_buf[7] = 's';
    local_4b8.field_2._M_local_buf[8] = 'i';
    local_4b8.field_2._M_local_buf[9] = 'z';
    local_4b8.field_2._M_local_buf[10] = 'e';
    local_4b8.field_2._M_local_buf[0xb] = ' ';
    local_4b8.field_2._M_local_buf[0xc] = 'o';
    local_4b8.field_2._M_local_buf[0xd] = 'f';
    local_4b8.field_2._M_local_buf[0xe] = ' ';
    local_4b8.field_2._M_local_buf[0xf] = 'a';
    local_4b8._M_dataplus._M_p._0_1_ = 'W';
    local_4b8._M_dataplus._M_p._1_1_ = 'i';
    local_4b8._M_dataplus._M_p._2_1_ = 'n';
    local_4b8._M_dataplus._M_p._3_1_ = 'd';
    local_4b8._M_dataplus._M_p._4_1_ = 'o';
    local_4b8._M_dataplus._M_p._5_1_ = 'w';
    local_4b8._M_dataplus._M_p._6_1_ = ' ';
    local_4b8._M_dataplus._M_p._7_1_ = 'i';
    local_4b8._M_string_length._0_1_ = 's';
    local_4b8._M_string_length._1_1_ = ' ';
    local_4b8._M_string_length._2_1_ = 't';
    local_4b8._M_string_length._3_1_ = 'o';
    local_4b8._M_string_length._4_1_ = 'o';
    local_4b8._M_string_length._5_1_ = ' ';
    local_4b8._M_string_length._6_1_ = 's';
    local_4b8._M_string_length._7_1_ = 'm';
    iVar9 = 0x41;
    if (0x41 < this->InitialWidth) {
      iVar9 = this->InitialWidth;
    }
    printw(&local_4b8,iVar9,6);
    if (_stdscr == 0) {
      iVar9 = -1;
    }
    else {
      iVar9 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar9,1);
    wrefresh(_stdscr);
    return;
  }
  local_540 = message;
  field = current_field((this->super_cmCursesForm).Form);
  uVar2 = field_index(field);
  if ((int)uVar2 < 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)field_userptr(this->Fields[(ulong)uVar2 - 2]);
  }
  local_538[0xe] = 0;
  local_538[0xf] = 0;
  local_538[0xc] = 0;
  local_538[0xd] = 0;
  local_538[10] = 0;
  local_538[0xb] = 0;
  local_538[8] = 0;
  local_538[9] = 0;
  local_538[6] = 0;
  local_538[7] = 0;
  local_538[4] = 0;
  local_538[5] = 0;
  local_538[2] = 0;
  local_538[3] = 0;
  local_538[0] = 0;
  local_538[1] = 0;
  if (plVar3 == (long *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = (char *)(**(code **)(*plVar3 + 0x28))(plVar3);
    pcVar1 = (this->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,pcVar4,(allocator<char> *)local_2b8);
    pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_4b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_4b8._M_dataplus._M_p._4_4_,local_4b8._M_dataplus._M_p._0_4_) !=
        &local_4b8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_4b8._M_dataplus._M_p._4_4_,local_4b8._M_dataplus._M_p._0_4_),
                      local_4b8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 == (char *)0x0) {
      local_538[0] = CONCAT62(local_538[0]._2_6_,0x20);
    }
    else {
      pcVar1 = (this->CMakeInstance->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,pcVar4,local_b8);
      local_2b8[0]._M_dataplus._M_p = (pointer)&local_2b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"HELPSTRING","");
      pcVar5 = cmState::GetCacheEntryProperty(pcVar1,&local_4b8,local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8[0]._M_dataplus._M_p != &local_2b8[0].field_2) {
        operator_delete(local_2b8[0]._M_dataplus._M_p,local_2b8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_4b8._M_dataplus._M_p._4_4_,local_4b8._M_dataplus._M_p._0_4_) !=
          &local_4b8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_4b8._M_dataplus._M_p._4_4_,local_4b8._M_dataplus._M_p._0_4_),
                        local_4b8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 == (char *)0x0) {
        local_538[0] = local_538[0] & 0xffffffffffffff00;
      }
      else {
        strncpy((char *)local_538,pcVar5,0x7f);
        local_538[0xf] = local_538[0xf] & 0xffffffffffffff;
      }
    }
  }
  sVar6 = strlen(pcVar4);
  sVar7 = strlen((char *)local_538);
  pcVar5 = local_540;
  uVar2 = 0x200;
  if (uVar10 < 0x200) {
    uVar2 = uVar10;
  }
  __n = (ulong)uVar2;
  if (local_540 == (char *)0x0) {
    strncpy((char *)&local_4b8,pcVar4,__n);
    if (__n <= sVar6) goto LAB_00142819;
    *(undefined2 *)((long)&local_4b8._M_dataplus._M_p + sVar6) = 0x203a;
    strncpy((char *)((long)&local_4b8._M_dataplus._M_p + sVar6 + 2),(char *)local_538,
            (__n - sVar6) - 2);
    sVar8 = sVar7 + sVar6 + 2;
    if (__n <= sVar8) goto LAB_00142819;
    __s = (void *)((long)&local_4b8._M_dataplus._M_p + sVar7 + sVar6 + 2);
  }
  else {
    sVar8 = strlen(local_540);
    strncpy((char *)&local_4b8,pcVar5,__n);
    if (__n <= sVar8) goto LAB_00142819;
    __s = (void *)((long)&local_4b8._M_dataplus._M_p + sVar8);
  }
  memset(__s,0x20,__n - sVar8);
LAB_00142819:
  *(undefined1 *)((long)&local_4b8._M_dataplus._M_p + __n) = 0;
  pcVar4 = cmVersion::GetCMakeVersion();
  sprintf((char *)local_b8,"CMake Version %s",pcVar4);
  sVar6 = strlen((char *)local_b8);
  memset(local_2b8,0x20,__n - sVar6);
  strcpy((char *)((long)local_2b8 + (__n - sVar6)),(char *)local_b8);
  *(undefined1 *)((long)&local_2b8[0]._M_dataplus._M_p + __n) = 0;
  local_542 = 0;
  local_544 = 0x7325;
  move(iVar9 + -5,0);
  wattr_on(_stdscr,0x10000,0);
  printw(&local_544,&local_4b8);
  wattr_off(_stdscr,0x10000,0);
  move(iVar9 + -4,0);
  printw(&local_544,local_2b8);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesMainForm::UpdateStatusBar(const char* message)
{
  int x, y;
  getmaxyx(stdscr, y, x);
  // If window size is too small, display error and return
  if (x < cmCursesMainForm::MIN_WIDTH || x < this->InitialWidth ||
      y < cmCursesMainForm::MIN_HEIGHT) {
    curses_clear();
    curses_move(0, 0);
    char fmt[] = "Window is too small. A size of at least %dx%d is required.";
    printw(fmt,
           (cmCursesMainForm::MIN_WIDTH < this->InitialWidth
              ? this->InitialWidth
              : cmCursesMainForm::MIN_WIDTH),
           cmCursesMainForm::MIN_HEIGHT);
    touchwin(stdscr);
    wrefresh(stdscr);
    return;
  }

  // Get the key of the current entry
  FIELD* cur = current_field(this->Form);
  int findex = field_index(cur);
  cmCursesWidget* lbl = nullptr;
  if (findex >= 0) {
    lbl = reinterpret_cast<cmCursesWidget*>(
      field_userptr(this->Fields[findex - 2]));
  }
  char help[128] = "";
  const char* curField = "";
  if (lbl) {
    curField = lbl->GetValue();

    // Get the help string of the current entry
    // and add it to the help string
    const char* existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
    if (existingValue) {
      const char* hs = this->CMakeInstance->GetState()->GetCacheEntryProperty(
        curField, "HELPSTRING");
      if (hs) {
        strncpy(help, hs, 127);
        help[127] = '\0';
      } else {
        help[0] = 0;
      }
    } else {
      sprintf(help, " ");
    }
  }

  // Join the key, help string and pad with spaces
  // (or truncate) as necessary
  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t curFieldLen = strlen(curField);
  size_t helpLen = strlen(help);

  size_t width = std::min<size_t>(x, cmCursesMainForm::MAX_WIDTH);

  if (message) {
    curField = message;
    curFieldLen = strlen(message);
    strncpy(bar, curField, width);
    if (curFieldLen < width) {
      memset(bar + curFieldLen, ' ', width - curFieldLen);
    }
  } else {
    strncpy(bar, curField, width);
    if (curFieldLen < width) {
      bar[curFieldLen] = ':';
      bar[curFieldLen + 1] = ' ';
      strncpy(bar + curFieldLen + 2, help, width - curFieldLen - 2);
      if (curFieldLen + helpLen + 2 < width) {
        memset(bar + curFieldLen + helpLen + 2, ' ',
               width - (curFieldLen + helpLen + 2));
      }
    }
  }

  bar[width] = '\0';

  // Display CMake version info on the next line
  // We want to display this on the right
  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp, "CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width - strlen(vertmp));
  memset(version, ' ', sideSpace);
  sprintf(version + sideSpace, "%s", vertmp);
  version[width] = '\0';

  // Now print both lines
  char fmt_s[] = "%s";
  curses_move(y - 5, 0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y - 4, 0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}